

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDisjointSets.h
# Opt level: O1

void __thiscall HighsDisjointSets<false>::reset(HighsDisjointSets<false> *this,HighsInt numItems)

{
  pointer piVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  int iVar13;
  undefined1 auVar12 [16];
  value_type_conflict2 local_14;
  undefined1 auVar11 [16];
  
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&this->sizes,(long)numItems,&local_14);
  std::vector<int,_std::allocator<int>_>::resize(&this->sets,(long)numItems);
  auVar5 = _DAT_003c57d0;
  auVar4 = _DAT_003c57c0;
  auVar3 = _DAT_003c57b0;
  piVar1 = (this->sets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->sets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    uVar6 = (long)piVar2 + (-4 - (long)piVar1);
    auVar12._8_4_ = (int)uVar6;
    auVar12._0_8_ = uVar6;
    auVar12._12_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6 >> 2;
    auVar8._8_8_ = auVar12._8_8_ >> 2;
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_003c57d0;
    do {
      iVar10 = (int)uVar7;
      auVar11._8_4_ = iVar10;
      auVar11._0_8_ = uVar7;
      auVar11._12_4_ = (int)(uVar7 >> 0x20);
      auVar12 = (auVar11 | auVar4) ^ auVar5;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        piVar1[uVar7] = iVar10;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        piVar1[uVar7 + 1] = iVar10 + 1;
      }
      auVar12 = (auVar11 | auVar3) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        piVar1[uVar7 + 2] = iVar10 + 2;
        piVar1[uVar7 + 3] = iVar10 + 3;
      }
      uVar7 = uVar7 + 4;
    } while (((uVar6 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
  }
  return;
}

Assistant:

void reset(HighsInt numItems) {
    sizes.assign(numItems, 1);
    sets.resize(numItems);
    std::iota(sets.begin(), sets.end(), 0);
  }